

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O1

PLTerm __thiscall
mp::BasicExprFactory<std::allocator<char>_>::EndPLTerm
          (BasicExprFactory<std::allocator<char>_> *this,PLTermBuilder builder,Reference arg)

{
  PLTerm PVar1;
  AssertionFailure *this_00;
  Impl *impl;
  
  impl = builder.impl_;
  if (impl->num_breakpoints + 1 == builder.slope_index_) {
    if (impl->num_breakpoints == builder.breakpoint_index_) {
      if ((ExprBase)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
          != (ExprBase)0x0) {
        impl->arg = (Impl *)arg.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase
                            .impl_;
        PVar1 = internal::ExprBase::Create<mp::PLTerm>(&impl->super_Impl);
        return (PLTerm)PVar1.super_BasicExpr<(mp::expr::Kind)40,_(mp::expr::Kind)40>.super_ExprBase.
                       impl_;
      }
      this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
      AssertionFailure::AssertionFailure(this_00,"invalid argument");
    }
    else {
      this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
      AssertionFailure::AssertionFailure(this_00,"too few breakpoints");
    }
  }
  else {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"too few slopes");
  }
  __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
}

Assistant:

PLTerm EndPLTerm(PLTermBuilder builder, Reference arg) {
    PLTerm::Impl *impl = builder.impl_;
    /// Check that all slopes and breakpoints provided.
    MP_ASSERT(builder.slope_index_ == impl->num_breakpoints + 1,
              "too few slopes");
    MP_ASSERT(builder.breakpoint_index_ == impl->num_breakpoints,
              "too few breakpoints");
    MP_ASSERT(arg != 0, "invalid argument");
    impl->arg = arg.impl_;
    return Expr::Create<PLTerm>(impl);
  }